

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItem(char *label,char *shortcut,bool *p_selected,bool enabled)

{
  bool bVar1;
  byte *in_RDX;
  bool in_stack_0000007e;
  bool in_stack_0000007f;
  char *in_stack_00000080;
  char *in_stack_00000088;
  bool local_1;
  
  bVar1 = MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
  if (bVar1) {
    if (in_RDX != (byte *)0x0) {
      *in_RDX = (*in_RDX ^ 0xff) & 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::MenuItem(const char* label, const char* shortcut, bool* p_selected, bool enabled)
{
    if (MenuItem(label, shortcut, p_selected ? *p_selected : false, enabled))
    {
        if (p_selected)
            *p_selected = !*p_selected;
        return true;
    }
    return false;
}